

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_wrapper.hpp
# Opt level: O2

PyObject *
boost::python::objects::
class_cref_wrapper<GlobalStimulationCommand,_boost::python::objects::make_instance<GlobalStimulationCommand,_boost::python::objects::value_holder<GlobalStimulationCommand>_>_>
::convert(GlobalStimulationCommand *x)

{
  PyObject *pPVar1;
  reference_wrapper<const_GlobalStimulationCommand> local_8;
  
  local_8.t_ = x;
  pPVar1 = make_instance_impl<GlobalStimulationCommand,boost::python::objects::value_holder<GlobalStimulationCommand>,boost::python::objects::make_instance<GlobalStimulationCommand,boost::python::objects::value_holder<GlobalStimulationCommand>>>
           ::execute<boost::reference_wrapper<GlobalStimulationCommand_const>const>(&local_8);
  return pPVar1;
}

Assistant:

static PyObject* convert(Src const& x)
    {
        return MakeInstance::execute(boost::ref(x));
    }